

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_tailer.cpp
# Opt level: O0

excerpt_tailer * __thiscall cornelich::excerpt_tailer::to_end(excerpt_tailer *this)

{
  char *__s;
  int __c;
  int64_t last_index;
  excerpt_tailer *this_local;
  
  __s = (char *)vanilla_chronicle::last_index(this->m_chronicle);
  if ((long)__s < 0) {
    this_local = to_start(this);
  }
  else {
    index(this,__s,__c);
    this_local = this;
  }
  return this_local;
}

Assistant:

excerpt_tailer & excerpt_tailer::to_end()
{
    auto last_index = m_chronicle.last_index();
    if(last_index >= 0)
        index(last_index);
    else
        return to_start();
    return *this;
}